

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O2

Vec4 __thiscall
deqp::gles3::Functional::TriangleDerivateCase::getSurfaceThreshold(TriangleDerivateCase *this)

{
  int iVar1;
  RenderTarget *pRVar2;
  long in_RSI;
  Vector<float,_4> *a;
  float extraout_XMM0_Da;
  float fVar3;
  float extraout_XMM0_Db;
  float fVar4;
  undefined8 in_XMM1_Qa;
  Vector<float,_4> VVar5;
  Vec4 VVar6;
  Vector<float,_4> local_68;
  Vector<float,_4> local_50;
  IVec4 intThreshold;
  tcu local_30 [16];
  
  a = &local_68;
  iVar1 = *(int *)(in_RSI + 0xe8);
  if (iVar1 == 2) {
LAB_010ee9e5:
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this,0.0);
    fVar3 = extraout_XMM0_Da;
    fVar4 = extraout_XMM0_Db;
  }
  else {
    if (iVar1 == 1) {
      tcu::Vector<int,_4>::Vector(&intThreshold,1);
    }
    else {
      if (iVar1 != 0) goto LAB_010ee9e5;
      pRVar2 = Context::getRenderTarget(*(Context **)(in_RSI + 0x70));
      local_68.m_data[0] = (float)(pRVar2->m_pixelFormat).redBits;
      local_68.m_data[1] = (float)(pRVar2->m_pixelFormat).greenBits;
      local_68.m_data[2] = (float)(pRVar2->m_pixelFormat).blueBits;
      local_68.m_data[3] = (float)(pRVar2->m_pixelFormat).alphaBits;
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_50,1);
      tcu::operator-(local_30,8,(Vector<int,_4> *)&local_68);
      tcu::operator<<((tcu *)&intThreshold,(Vector<int,_4> *)&local_50,(Vector<int,_4> *)local_30);
      a = &local_50;
    }
    tcu::Vector<int,_4>::cast<float>((Vector<int,_4> *)a);
    VVar5 = tcu::operator/((tcu *)this,a,255.0);
    in_XMM1_Qa = VVar5.m_data._8_8_;
    fVar3 = VVar5.m_data[0];
    fVar4 = VVar5.m_data[1];
  }
  VVar6.m_data[1] = fVar4;
  VVar6.m_data[0] = fVar3;
  VVar6.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar6.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  return (Vec4)VVar6.m_data;
}

Assistant:

tcu::Vec4 TriangleDerivateCase::getSurfaceThreshold (void) const
{
	switch (m_surfaceType)
	{
		case SURFACETYPE_DEFAULT_FRAMEBUFFER:
		{
			const tcu::PixelFormat	pixelFormat		= m_context.getRenderTarget().getPixelFormat();
			const tcu::IVec4		channelBits		(pixelFormat.redBits, pixelFormat.greenBits, pixelFormat.blueBits, pixelFormat.alphaBits);
			const tcu::IVec4		intThreshold	= tcu::IVec4(1) << (8 - channelBits);
			const tcu::Vec4			normThreshold	= intThreshold.asFloat() / 255.0f;

			return normThreshold;
		}

		case SURFACETYPE_UNORM_FBO:				return tcu::IVec4(1).asFloat() / 255.0f;
		case SURFACETYPE_FLOAT_FBO:				return tcu::Vec4(0.0f);
		default:
			DE_ASSERT(false);
			return tcu::Vec4(0.0f);
	}
}